

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix2 * matrix2_invert(matrix2 *self)

{
  matrix2 *pmVar1;
  float afVar2 [2];
  byte local_21;
  undefined1 local_20 [7];
  uint8_t i;
  matrix2 inverse;
  matrix2 *self_local;
  
  inverse.field_0.field_1.m22[1] = (float  [2])self;
  pmVar1 = matrix2_inverse(self,(matrix2 *)local_20);
  if (pmVar1 != (matrix2 *)0x0) {
    for (local_21 = 0; local_21 < 4; local_21 = local_21 + 1) {
      *(undefined4 *)((long)inverse.field_0.field_1.m22[1] + (ulong)local_21 * 4) =
           *(undefined4 *)(local_20 + (ulong)local_21 * 4);
    }
  }
  afVar2[0] = (float)inverse.field_0._8_4_;
  afVar2[1] = (float)inverse.field_0._12_4_;
  return (matrix2 *)afVar2;
}

Assistant:

HYPAPI struct matrix2 *matrix2_invert(struct matrix2 *self)
{
	struct matrix2 inverse;
	uint8_t i;

	if (matrix2_inverse(self, &inverse)) {
		for (i = 0; i < 4; i++) {
			self->m[i] = inverse.m[i];
		}
	}

	return self;
}